

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void __thiscall QApplication::setStyleSheet(QApplication *this,QString *styleSheet)

{
  bool bVar1;
  QStyleSheetStyle *app;
  QString *in_RSI;
  QStyleSheetStyle *newStyleSheetStyle;
  QStyleSheetStyle *styleSheetStyle;
  QStyle *in_stack_ffffffffffffffd8;
  QStyleSheetStyle *in_stack_ffffffffffffffe0;
  
  QString::operator=(&QApplicationPrivate::styleSheet,in_RSI);
  app = qt_styleSheet((QStyle *)0x2caf72);
  bVar1 = QString::isEmpty((QString *)0x2caf81);
  if (bVar1) {
    if (app != (QStyleSheetStyle *)0x0) {
      setStyle((QStyle *)styleSheet);
    }
  }
  else if (app == (QStyleSheetStyle *)0x0) {
    operator_new(0x60);
    QStyleSheetStyle::QStyleSheetStyle(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    QObject::setParent(&QApplicationPrivate::app_style->super_QObject);
    setStyle((QStyle *)styleSheet);
  }
  else {
    QCoreApplication::instance();
    QStyleSheetStyle::repolish(in_stack_ffffffffffffffe0,(QApplication *)app);
  }
  return;
}

Assistant:

void QApplication::setStyleSheet(const QString& styleSheet)
{
    QApplicationPrivate::styleSheet = styleSheet;
    QStyleSheetStyle *styleSheetStyle = qt_styleSheet(QApplicationPrivate::app_style);
    if (styleSheet.isEmpty()) { // application style sheet removed
        if (!styleSheetStyle)
            return; // there was no stylesheet before
        setStyle(styleSheetStyle->base);
    } else if (styleSheetStyle) { // style sheet update, just repolish
        styleSheetStyle->repolish(qApp);
    } else { // stylesheet set the first time
        QStyleSheetStyle *newStyleSheetStyle = new QStyleSheetStyle(QApplicationPrivate::app_style);
        QApplicationPrivate::app_style->setParent(newStyleSheetStyle);
        setStyle(newStyleSheetStyle);
    }
}